

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  _Any_data local_100 [2];
  InetAddr server_addr;
  _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<cube::http::HTTPConnection>,_const_cube::http::HTTPRequest_&)>
  local_d0;
  HTTPServer http_server;
  
  signal(2,HandleSignal);
  cube::net::InetAddr::InetAddr(&server_addr,0x2108);
  cube::http::HTTPServer::HTTPServer(&http_server,&g_event_loop,&server_addr);
  local_d0._M_f = HelloHandler;
  std::function<void(std::shared_ptr<cube::http::HTTPConnection>,cube::http::HTTPRequest_const&)>::
  function<std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<cube::http::HTTPConnection>,cube::http::HTTPRequest_const&)>,void>
            ((function<void(std::shared_ptr<cube::http::HTTPConnection>,cube::http::HTTPRequest_const&)>
              *)local_100[0]._M_pod_data,&local_d0);
  std::function<void_(std::shared_ptr<cube::http::HTTPConnection>,_const_cube::http::HTTPRequest_&)>
  ::operator=(&http_server.m_request_callback,
              (function<void_(std::shared_ptr<cube::http::HTTPConnection>,_const_cube::http::HTTPRequest_&)>
               *)local_100);
  std::_Function_base::~_Function_base((_Function_base *)local_100);
  bVar1 = cube::http::HTTPServer::Start(&http_server);
  if (bVar1) {
    cube::net::InetAddr::IpPort_abi_cxx11_((string *)local_100,&server_addr);
    printf("http server start succ, listen addr=%s\n",local_100[0]._M_unused._M_object);
    std::__cxx11::string::~string((string *)local_100[0]._M_pod_data);
    cube::net::EventLoop::Loop(&g_event_loop);
    cube::http::HTTPServer::~HTTPServer(&http_server);
    return 0;
  }
  __assert_fail("http_server.Start()",
                "/workspace/llm4binary/github/license_c_cmakelists/yplusplus[P]cube/examples/http_svr/main.cpp"
                ,0x29,"int main()");
}

Assistant:

int main() {
    signal(SIGINT, HandleSignal);

    InetAddr server_addr(8456);
    HTTPServer http_server(&g_event_loop, server_addr);
    //http_server.SetKeepAlive(true);
    http_server.SetRequestCallback(std::bind(&HelloHandler, _1, _2));
    assert(http_server.Start());
    printf("http server start succ, listen addr=%s\n", server_addr.IpPort().c_str());

    g_event_loop.Loop();

    return 0;
}